

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O2

void __thiscall
icu_63::TimeArrayTimeZoneRule::TimeArrayTimeZoneRule
          (TimeArrayTimeZoneRule *this,UnicodeString *name,int32_t rawOffset,int32_t dstSavings,
          UDate *startTimes,int32_t numStartTimes,TimeRuleType timeRuleType)

{
  uint in_EAX;
  UErrorCode status;
  undefined8 uStack_28;
  
  uStack_28._0_4_ = in_EAX;
  TimeZoneRule::TimeZoneRule(&this->super_TimeZoneRule,name,rawOffset,dstSavings);
  (this->super_TimeZoneRule).super_UObject._vptr_UObject =
       (_func_int **)&PTR__TimeArrayTimeZoneRule_0045fdc0;
  this->fTimeRuleType = timeRuleType;
  this->fStartTimes = (UDate *)0x0;
  uStack_28 = (ulong)(uint)uStack_28;
  initStartTimes(this,startTimes,numStartTimes,(UErrorCode *)((long)&uStack_28 + 4));
  return;
}

Assistant:

TimeArrayTimeZoneRule::TimeArrayTimeZoneRule(const UnicodeString& name,
                                             int32_t rawOffset,
                                             int32_t dstSavings,
                                             const UDate* startTimes,
                                             int32_t numStartTimes,
                                             DateTimeRule::TimeRuleType timeRuleType)
: TimeZoneRule(name, rawOffset, dstSavings), fTimeRuleType(timeRuleType),
  fStartTimes(NULL) {
    UErrorCode status = U_ZERO_ERROR;
    initStartTimes(startTimes, numStartTimes, status);
    //TODO - status?
}